

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputToFont.cpp
# Opt level: O2

int __thiscall GrcManager::CalculateSilfVersion(GrcManager *this,int fxdSilfSpecVersion)

{
  GdlGlyphClassDefn *pGVar1;
  pointer ppGVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int ipglfc;
  long lVar6;
  ulong uVar7;
  long lVar8;
  allocator local_109;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vwGlyphs;
  vector<int,_std::allocator<int>_> vnIndices;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar5 = 0x50000;
  if (0x50000 < fxdSilfSpecVersion) {
    iVar5 = fxdSilfSpecVersion;
  }
  if (this->m_tcCompressor == ktcNone) {
    iVar5 = fxdSilfSpecVersion;
  }
  bVar3 = GdlRenderer::HasCollisionPass(this->m_prndr);
  iVar4 = 0x40001;
  if (0x40001 < iVar5) {
    iVar4 = iVar5;
  }
  if (!bVar3) {
    iVar4 = iVar5;
  }
  iVar5 = 0x40000;
  if (0x40000 < iVar4) {
    iVar5 = iVar4;
  }
  if (this->m_fPassOptimizations == false) {
    iVar5 = iVar4;
  }
  if (iVar5 < 0x40000) {
    uVar7 = ((long)(this->m_vpglfcReplcmtClasses).
                   super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_vpglfcReplcmtClasses).
                   super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2) + 6;
    for (lVar6 = 0; lVar8 = (long)this->m_cpglfcLinear, lVar6 < lVar8; lVar6 = lVar6 + 1) {
      pGVar1 = (this->m_vpglfcReplcmtClasses).
               super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>._M_impl
               .super__Vector_impl_data._M_start[lVar6];
      vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (**(code **)((long)(pGVar1->super_GdlGlyphClassMember).super_GdlDefn._vptr_GdlDefn + 0xb0))
                (pGVar1,&vwGlyphs.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
      uVar7 = (long)vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
              (uVar7 - (long)vwGlyphs.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    }
    for (; ppGVar2 = (this->m_vpglfcReplcmtClasses).
                     super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
        lVar8 < (int)((ulong)((long)(this->m_vpglfcReplcmtClasses).
                                    super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2) >> 3
                     ); lVar8 = lVar8 + 1) {
      pGVar1 = ppGVar2[lVar8];
      vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vnIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      vnIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vnIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      (**(code **)((long)(pGVar1->super_GdlGlyphClassMember).super_GdlDefn._vptr_GdlDefn + 0xb8))
                (pGVar1,&vwGlyphs.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>,
                 &vnIndices.super__Vector_base<int,_std::allocator<int>_>);
      uVar7 = uVar7 + 8 +
              ((long)vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start) * 2;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&vnIndices.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&vwGlyphs.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    }
    if (0xffff < uVar7) {
      iVar5 = 0x40000;
    }
  }
  if ((fxdSilfSpecVersion < iVar5) && (this->m_fUserSpecifiedVersion == true)) {
    std::__cxx11::string::string((string *)&local_90,"Version ",(allocator *)&vwGlyphs);
    VersionString_abi_cxx11_(&local_b0,fxdSilfSpecVersion);
    std::__cxx11::string::string
              ((string *)&local_d0,
               " of the Silf table is inadequate for your specification; version ",
               (allocator *)&vnIndices);
    VersionString_abi_cxx11_(&local_50,iVar5);
    std::__cxx11::string::string((string *)&local_70," will be generated instead.",&local_109);
    GrcErrorList::AddWarning
              (&g_errorList,0x1580,(GdlObject *)0x0,&local_90,&local_b0,&local_d0,&local_50,
               &local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  this->m_fxdSilfTableVersion = iVar5;
  return iVar5;
}

Assistant:

int GrcManager::CalculateSilfVersion(int fxdSilfSpecVersion)
{
	int fxdResult = fxdSilfSpecVersion;

	if (m_tcCompressor != ktcNone && fxdResult < 0x00050000)
	{
	    fxdResult = 0x00050000;
	}
	if (m_prndr->HasCollisionPass() && fxdResult < 0x00040001)
	{
		fxdResult = 0x00040001;
	}
	if (this->IncludePassOptimizations() && fxdResult < 0x00040000)
	{
		// Although earlier versions of the Silf table have space for the skip-passes attribute,
		// OTS will complain if the value is anything other than zero. So bump up the version
		// to match.
		fxdResult = 0x00040000;
	}
	if (fxdResult < 0x00040000)
	{
		//	Calculate it based on what is needed to handle the size of the class map
		//	(replacement class data).
		size_t cbSpaceNeeded;	// # of bytes needed = max offset

		//	number of classes
		cbSpaceNeeded = 4;

		//	the offsets to classes themselves, assuming short ints
		cbSpaceNeeded += (m_vpglfcReplcmtClasses.size() + 1) * 2;

		//	Space needed for the class glyph lists

		for (int ipglfc = 0; ipglfc < m_cpglfcLinear; ipglfc++)
		{
			GdlGlyphClassDefn * pglfc = m_vpglfcReplcmtClasses[ipglfc];

			Assert(pglfc->ReplcmtOutputClass() || pglfc->GlyphIDCount() <= 1);
			//Assert(pglfc->ReplcmtOutputID() == cTmp);

			std::vector<utf16> vwGlyphs;
			pglfc->GenerateOutputGlyphList(vwGlyphs);

			cbSpaceNeeded += vwGlyphs.size() * 2;
		}

		//	indexed classes (input)
		for (int ipglfc = m_cpglfcLinear; ipglfc < signed(m_vpglfcReplcmtClasses.size()); ipglfc++)
		{
			GdlGlyphClassDefn * pglfc = m_vpglfcReplcmtClasses[ipglfc];

			Assert(pglfc->ReplcmtInputClass());
			//Assert(pglfc->ReplcmtInputID() == cTmp);

			std::vector<utf16> vwGlyphs;
			std::vector<int> vnIndices;
			pglfc->GenerateInputGlyphList(vwGlyphs, vnIndices);
			int n = signed(vwGlyphs.size());
			cbSpaceNeeded += 8;	// search constants
			cbSpaceNeeded += vwGlyphs.size() * 4;
		}

		if (cbSpaceNeeded > 0xFFFF)
		{
			// Offsets won't all fit in short ints; we need long ints.
			fxdResult = 0x00040000;
		}
	}

	if (fxdResult > fxdSilfSpecVersion)
	{
		if (UserSpecifiedVersion())
			g_errorList.AddWarning(5504, NULL,
				"Version ",
				VersionString(fxdSilfSpecVersion),
				" of the Silf table is inadequate for your specification; version ",
				VersionString(fxdResult),
				" will be generated instead.");

//		else
//			g_errorList.AddWarning(5505, NULL,
//				"Version ",
//				VersionString(fxdResult),
//				" of the Silf table will be generated.");
	}

	SetTableVersion(ktiSilf, fxdResult);

	return fxdResult;
}